

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBatchTestHandler.cxx
# Opt level: O2

void __thiscall cmCTestBatchTestHandler::WriteBatchScript(cmCTestBatchTestHandler *this)

{
  _Base_ptr p_Var1;
  string sStack_248;
  ofstream fout;
  
  cmCTest::GetBinaryDir_abi_cxx11_(&sStack_248,(this->super_cmCTestMultiProcessHandler).CTest);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                 &sStack_248,"/Testing/CTestBatch.txt");
  std::__cxx11::string::operator=((string *)&this->Script,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  std::__cxx11::string::~string((string *)&sStack_248);
  std::ofstream::ofstream(&fout);
  std::ofstream::open((char *)&fout,(_Ios_Openmode)(this->Script)._M_dataplus._M_p);
  std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"#!/bin/sh\n");
  for (p_Var1 = *(_Base_ptr *)
                 ((long)&(this->super_cmCTestMultiProcessHandler).Tests.
                         super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                         ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      (_Rb_tree_header *)p_Var1 !=
      &(this->super_cmCTestMultiProcessHandler).Tests.
       super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ._M_t._M_impl.super__Rb_tree_header; p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    WriteSrunArgs(this,p_Var1[1]._M_color,&fout.super_basic_ostream<char,_std::char_traits<char>_>);
    WriteTestCommand(this,p_Var1[1]._M_color,
                     &fout.super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  }
  std::ostream::flush();
  std::ofstream::close();
  std::ofstream::~ofstream(&fout);
  return;
}

Assistant:

void cmCTestBatchTestHandler::WriteBatchScript()
{
  this->Script = this->CTest->GetBinaryDir() + "/Testing/CTestBatch.txt";
  cmsys::ofstream fout;
  fout.open(this->Script.c_str());
  fout << "#!/bin/sh\n";

  for (TestMap::iterator i = this->Tests.begin(); i != this->Tests.end();
       ++i) {
    this->WriteSrunArgs(i->first, fout);
    this->WriteTestCommand(i->first, fout);
    fout << "\n";
  }
  fout.flush();
  fout.close();
}